

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::DummyBinding::Bind
          (BindResult *__return_storage_ptr__,DummyBinding *this,ColumnRefExpression *colref,
          idx_t depth)

{
  size_type __n;
  pointer pcVar1;
  string *psVar2;
  iterator iVar3;
  reference args_1;
  InternalException *this_00;
  ColumnBinding binding;
  Expression *local_90;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  idx_t local_60;
  ColumnBinding local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_60 = depth;
  psVar2 = ColumnRefExpression::GetColumnName_abi_cxx11_(colref);
  iVar3 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->super_Binding).name_map._M_h,psVar2);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur != (__node_type *)0x0) {
    __n = *(size_type *)
           ((long)iVar3.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                  ._M_cur + 0x28);
    local_58.table_index = (this->super_Binding).index;
    local_58.column_index = __n;
    (*(colref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              (&local_80,colref);
    args_1 = vector<duckdb::LogicalType,_true>::operator[](&(this->super_Binding).types,__n);
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding&,unsigned_long&>
              ((duckdb *)&local_90,&local_80,args_1,&local_58,&local_60);
    local_88._M_head_impl = local_90;
    local_90 = (Expression *)0x0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_88);
    if (local_88._M_head_impl != (Expression *)0x0) {
      (*((local_88._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_88._M_head_impl = (Expression *)0x0;
    if (local_90 != (Expression *)0x0) {
      (**(code **)(*(long *)local_90 + 8))();
    }
    local_90 = (Expression *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"Column %s not found in bindings","");
  psVar2 = ColumnRefExpression::GetColumnName_abi_cxx11_(colref);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + psVar2->_M_string_length);
  InternalException::InternalException<std::__cxx11::string>(this_00,&local_80,&local_48);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BindResult DummyBinding::Bind(ColumnRefExpression &colref, idx_t depth) {
	column_t column_index;
	if (!TryGetBindingIndex(colref.GetColumnName(), column_index)) {
		throw InternalException("Column %s not found in bindings", colref.GetColumnName());
	}
	ColumnBinding binding(index, column_index);

	// we are binding a parameter to create the dummy binding, no arguments are supplied
	return BindResult(make_uniq<BoundColumnRefExpression>(colref.GetName(), types[column_index], binding, depth));
}